

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

parser_error parse_vault_rows(parser *p)

{
  char *__s1;
  uint uVar1;
  int iVar2;
  void *pvVar3;
  parser_error pVar4;
  long lVar5;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    uVar1 = parser_getuint(p,"height");
    *(char *)((long)pvVar3 + 0x22) = (char)uVar1;
    __s1 = *(char **)((long)pvVar3 + 0x18);
    pVar4 = PARSE_ERROR_NO_ROOM_FOUND;
    for (lVar5 = 8; lVar5 != 0x1d0; lVar5 = lVar5 + 0x18) {
      iVar2 = strcmp(__s1,*(char **)((long)&base_descs[0x70].menu_name + lVar5));
      if (iVar2 == 0) {
        if (*(int *)((long)&room_builders[0].name + lVar5) < (int)(uVar1 & 0xff)) {
          return PARSE_ERROR_VAULT_TOO_BIG;
        }
        return PARSE_ERROR_NONE;
      }
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_vault_rows(struct parser *p) {
	struct vault *v = parser_priv(p);
	size_t i;

	if (!v)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	v->hgt = parser_getuint(p, "height");

	/* Make sure vaults are no higher than the room profiles allow. */
	for (i = 0; i < N_ELEMENTS(room_builders); i++)
		if (streq(v->typ, room_builders[i].name))
			break;
	if (i == N_ELEMENTS(room_builders))
		return PARSE_ERROR_NO_ROOM_FOUND;
	if (v->hgt > room_builders[i].max_height)
		return PARSE_ERROR_VAULT_TOO_BIG;
	return PARSE_ERROR_NONE;
}